

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int avx512_array_container_to_uint32_array
              (void *vout,uint16_t *array,size_t cardinality,uint32_t base)

{
  undefined1 (*pauVar1) [64];
  uint in_ECX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  uint32_t val;
  __m512i voutput;
  __m256i vinput;
  size_t i;
  uint32_t *out;
  int outpos;
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [64];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  ulong local_2f8;
  long local_2f0;
  int local_2e8;
  uint local_2e4;
  ulong local_2e0;
  long local_2d8;
  undefined1 (*local_2c8) [32];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [64];
  uint local_104;
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  undefined1 (*local_58) [64];
  
  local_2e8 = 0;
  local_2f0 = in_RDI;
  local_2e4 = in_ECX;
  local_2e0 = in_RDX;
  local_2d8 = in_RSI;
  for (local_2f8 = 0; local_2f8 + 0x10 <= local_2e0; local_2f8 = local_2f8 + 0x10) {
    local_2c8 = (undefined1 (*) [32])(local_2d8 + local_2f8 * 2);
    local_3a0 = *(undefined8 *)*local_2c8;
    uStack_398 = *(undefined8 *)(*local_2c8 + 8);
    uStack_390 = *(undefined8 *)(*local_2c8 + 0x10);
    uStack_388 = *(undefined8 *)(*local_2c8 + 0x18);
    auVar2 = vpmovzxwd_avx512f(*local_2c8);
    local_104 = local_2e4;
    auVar3 = vpbroadcastd_avx512f(ZEXT416(local_2e4));
    local_180 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(local_180);
    local_400 = vmovdqa64_avx512f(auVar2);
    local_440 = vmovdqa64_avx512f(auVar3);
    local_320 = local_3a0;
    uStack_318 = uStack_398;
    uStack_310 = uStack_390;
    uStack_308 = uStack_388;
    local_1c0 = local_3a0;
    uStack_1b8 = uStack_398;
    uStack_1b0 = uStack_390;
    uStack_1a8 = uStack_388;
    local_1a0 = local_3a0;
    uStack_198 = uStack_398;
    uStack_190 = uStack_390;
    uStack_188 = uStack_388;
    memcpy(local_280,local_440,0x40);
    memcpy(local_2c0,local_400,0x40);
    auVar2 = vmovdqa64_avx512f(local_2c0);
    auVar3 = vmovdqa64_avx512f(local_280);
    local_200 = vmovdqa64_avx512f(auVar2);
    local_240 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(local_200);
    auVar3 = vmovdqa64_avx512f(local_240);
    auVar2 = vpaddd_avx512f(auVar2,auVar3);
    local_380 = vmovdqa64_avx512f(auVar2);
    pauVar1 = (undefined1 (*) [64])(local_2f0 + (long)local_2e8 * 4);
    auVar2 = vmovdqa64_avx512f(local_380);
    local_480 = vmovdqa64_avx512f(auVar2);
    memcpy(local_100,local_480,0x40);
    auVar2 = vmovdqa64_avx512f(local_100);
    local_c0 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(local_c0);
    auVar2 = vmovdqu64_avx512f(auVar2);
    *pauVar1 = auVar2;
    local_2e8 = local_2e8 + 0x10;
    local_58 = pauVar1;
  }
  for (; local_2f8 < local_2e0; local_2f8 = local_2f8 + 1) {
    *(uint *)(local_2f0 + (long)local_2e8 * 4) = local_2e4 + *(ushort *)(local_2d8 + local_2f8 * 2);
    local_2e8 = local_2e8 + 1;
  }
  return local_2e8;
}

Assistant:

int avx512_array_container_to_uint32_array(void *vout, const uint16_t *array,
                                           size_t cardinality, uint32_t base) {
    int outpos = 0;
    uint32_t *out = (uint32_t *)vout;
    size_t i = 0;
    for (; i + sizeof(__m256i) / sizeof(uint16_t) <= cardinality;
         i += sizeof(__m256i) / sizeof(uint16_t)) {
        __m256i vinput = _mm256_loadu_si256((const __m256i *)(array + i));
        __m512i voutput = _mm512_add_epi32(_mm512_cvtepu16_epi32(vinput),
                                           _mm512_set1_epi32(base));
        _mm512_storeu_si512((__m512i *)(out + outpos), voutput);
        outpos += sizeof(__m512i) / sizeof(uint32_t);
    }
    for (; i < cardinality; ++i) {
        const uint32_t val = base + array[i];
        memcpy(out + outpos, &val,
               sizeof(uint32_t));  // should be compiled as a MOV on x64
        outpos++;
    }
    return outpos;
}